

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O3

int bt_plane_clip_triangle
              (cbtVector4 *plane,cbtVector3 *point0,cbtVector3 *point1,cbtVector3 *point2,
              cbtVector3 *clipped)

{
  undefined8 *puVar1;
  cbtScalar cVar2;
  cbtScalar cVar3;
  ulong uVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  
  fVar18 = (plane->super_cbtVector3).m_floats[1];
  cVar2 = (plane->super_cbtVector3).m_floats[0];
  cVar3 = (plane->super_cbtVector3).m_floats[2];
  fVar14 = (plane->super_cbtVector3).m_floats[3];
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar18 * point0->m_floats[1])),ZEXT416((uint)cVar2),
                            ZEXT416((uint)point0->m_floats[0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)cVar3),ZEXT416((uint)point0->m_floats[2]));
  fVar5 = auVar12._0_4_ - fVar14;
  bVar9 = fVar5 <= 1.1920929e-07;
  if (bVar9) {
    uVar6 = *(undefined8 *)(point0->m_floats + 2);
    *(undefined8 *)clipped->m_floats = *(undefined8 *)point0->m_floats;
    *(undefined8 *)(clipped->m_floats + 2) = uVar6;
    cVar2 = (plane->super_cbtVector3).m_floats[0];
    fVar18 = (plane->super_cbtVector3).m_floats[1];
    cVar3 = (plane->super_cbtVector3).m_floats[2];
    fVar14 = (plane->super_cbtVector3).m_floats[3];
  }
  uVar10 = (uint)bVar9;
  uVar4 = *(ulong *)point1->m_floats;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar4;
  auVar12 = vmovshdup_avx(auVar13);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * fVar18)),auVar13,ZEXT416((uint)cVar2));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)point1->m_floats[2]),ZEXT416((uint)cVar3));
  auVar13 = ZEXT416((uint)fVar5);
  auVar15 = SUB6416(ZEXT464(0x34000000),0);
  uVar6 = vcmpps_avx512vl(auVar15,auVar13,5);
  fVar14 = auVar12._0_4_ - fVar14;
  uVar7 = vcmpps_avx512vl(auVar15,ZEXT416((uint)fVar14),1);
  if ((((ushort)uVar6 ^ (ushort)uVar7) & 1) == 0) {
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar13,auVar12);
    uVar10 = uVar10 + 1;
    fVar21 = auVar12._0_4_ / (fVar14 - fVar5);
    fVar18 = 1.0 - fVar21;
    auVar19._0_4_ = (float)uVar4 * fVar21 + (float)*(undefined8 *)point0->m_floats * fVar18;
    auVar19._4_4_ =
         (float)(uVar4 >> 0x20) * fVar21 +
         (float)((ulong)*(undefined8 *)point0->m_floats >> 0x20) * fVar18;
    auVar19._8_4_ = fVar21 * 0.0 + fVar18 * 0.0;
    auVar19._12_4_ = fVar21 * 0.0 + fVar18 * 0.0;
    auVar12 = vinsertps_avx(auVar19,ZEXT416((uint)(point1->m_floats[2] * fVar21 +
                                                  fVar18 * point0->m_floats[2])),0x28);
    *(undefined1 (*) [16])clipped[bVar9].m_floats = auVar12;
  }
  if (fVar14 <= 1.1920929e-07) {
    uVar6 = *(undefined8 *)(point1->m_floats + 2);
    uVar11 = uVar10 << 4;
    uVar10 = uVar10 + 1;
    puVar1 = (undefined8 *)((long)clipped->m_floats + (ulong)uVar11);
    *puVar1 = *(undefined8 *)point1->m_floats;
    puVar1[1] = uVar6;
  }
  uVar4 = *(ulong *)point2->m_floats;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar4;
  uVar6 = vcmpps_avx512vl(auVar15,ZEXT416((uint)fVar14),5);
  auVar12 = vmovshdup_avx(auVar20);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar12._0_4_ * (plane->super_cbtVector3).m_floats[1])),
                            auVar20,ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)point2->m_floats[2]),
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
  fVar18 = auVar12._0_4_ - (plane->super_cbtVector3).m_floats[3];
  uVar7 = vcmpps_avx512vl(auVar15,ZEXT416((uint)fVar18),1);
  uVar11 = uVar10;
  if ((((ushort)uVar6 ^ (ushort)uVar7) & 1) == 0) {
    auVar8._8_4_ = 0x80000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar8._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar14),auVar8);
    uVar11 = uVar10 + 1;
    fVar21 = auVar12._0_4_ / (fVar18 - fVar14);
    fVar14 = 1.0 - fVar21;
    auVar17._0_4_ = (float)uVar4 * fVar21 + (float)*(undefined8 *)point1->m_floats * fVar14;
    auVar17._4_4_ =
         (float)(uVar4 >> 0x20) * fVar21 +
         (float)((ulong)*(undefined8 *)point1->m_floats >> 0x20) * fVar14;
    auVar17._8_4_ = fVar21 * 0.0 + fVar14 * 0.0;
    auVar17._12_4_ = fVar21 * 0.0 + fVar14 * 0.0;
    auVar12 = vinsertps_avx(auVar17,ZEXT416((uint)(point2->m_floats[2] * fVar21 +
                                                  fVar14 * point1->m_floats[2])),0x28);
    *(undefined1 (*) [16])((long)clipped->m_floats + (ulong)(uVar10 << 4)) = auVar12;
  }
  if (fVar18 <= 1.1920929e-07) {
    uVar6 = *(undefined8 *)(point2->m_floats + 2);
    uVar10 = uVar11 << 4;
    uVar11 = uVar11 + 1;
    puVar1 = (undefined8 *)((long)clipped->m_floats + (ulong)uVar10);
    *puVar1 = *(undefined8 *)point2->m_floats;
    puVar1[1] = uVar6;
  }
  uVar6 = vcmpps_avx512vl(auVar15,ZEXT416((uint)fVar18),5);
  uVar7 = vcmpps_avx512vl(auVar15,auVar13,1);
  uVar10 = uVar11;
  if ((((ushort)uVar7 ^ (ushort)uVar6) & 1) == 0) {
    auVar15._8_4_ = 0x80000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar15._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(ZEXT416((uint)fVar18),auVar15);
    uVar10 = uVar11 + 1;
    fVar14 = auVar12._0_4_ / (fVar5 - fVar18);
    fVar18 = 1.0 - fVar14;
    auVar16._0_4_ =
         fVar18 * (float)*(undefined8 *)point2->m_floats +
         fVar14 * (float)*(undefined8 *)point0->m_floats;
    auVar16._4_4_ =
         fVar18 * (float)((ulong)*(undefined8 *)point2->m_floats >> 0x20) +
         fVar14 * (float)((ulong)*(undefined8 *)point0->m_floats >> 0x20);
    auVar16._8_4_ = fVar18 * 0.0 + fVar14 * 0.0;
    auVar16._12_4_ = fVar18 * 0.0 + fVar14 * 0.0;
    auVar12 = vinsertps_avx(auVar16,ZEXT416((uint)(fVar18 * point2->m_floats[2] +
                                                  fVar14 * point0->m_floats[2])),0x28);
    *(undefined1 (*) [16])((long)clipped->m_floats + (ulong)(uVar11 << 4)) = auVar12;
  }
  if (fVar5 <= 1.1920929e-07) {
    uVar6 = *(undefined8 *)(point0->m_floats + 2);
    uVar11 = uVar10 << 4;
    uVar10 = uVar10 + 1;
    puVar1 = (undefined8 *)((long)clipped->m_floats + (ulong)uVar11);
    *puVar1 = *(undefined8 *)point0->m_floats;
    puVar1[1] = uVar6;
  }
  return uVar10;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}